

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)10,(moira::Mode)2,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Imu im;
  StrWriter *pSVar1;
  Ea<(moira::Mode)2,_(moira::Size)4> dst;
  Ea<(moira::Mode)2,_(moira::Size)4> local_44;
  
  im.raw = dasmRead<(moira::Size)4>(this,addr);
  local_44.reg = op & 7;
  local_44.pc = *addr;
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)(this->tab).raw);
  StrWriter::operator<<(pSVar1,im);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<(pSVar1,&local_44);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imu      ( dasmRead<S>(addr)          );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}